

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O2

Matrix3x3 * __thiscall CS248::Matrix3x3::inv(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar9 = this->entries[2].y;
  dVar1 = this->entries[1].y;
  dVar2 = this->entries[2].x;
  dVar3 = this->entries[0].x;
  dVar4 = this->entries[0].y;
  dVar5 = this->entries[2].z;
  dVar7 = this->entries[0].z;
  dVar8 = this->entries[1].x;
  dVar6 = this->entries[1].z;
  __return_storage_ptr__->entries[2].x = dVar1 * -dVar2 + dVar8 * dVar9;
  __return_storage_ptr__->entries[2].y = dVar4 * dVar2 + -dVar3 * dVar9;
  __return_storage_ptr__->entries[0].x = dVar6 * -dVar9 + dVar5 * dVar1;
  __return_storage_ptr__->entries[0].y = dVar7 * dVar9 + -dVar4 * dVar5;
  __return_storage_ptr__->entries[0].z = dVar7 * -dVar1 + dVar4 * dVar6;
  __return_storage_ptr__->entries[1].x = dVar6 * dVar2 + -dVar8 * dVar5;
  __return_storage_ptr__->entries[1].y = -dVar2 * dVar7 + dVar3 * dVar5;
  __return_storage_ptr__->entries[1].z = dVar7 * dVar8 + -dVar3 * dVar6;
  __return_storage_ptr__->entries[2].z = dVar1 * dVar3 - dVar8 * dVar4;
  dVar9 = det(this);
  operator/=(__return_storage_ptr__,dVar9);
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::inv( void ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    B(0,0) = -A(1,2)*A(2,1) + A(1,1)*A(2,2); B(0,1) =  A(0,2)*A(2,1) - A(0,1)*A(2,2); B(0,2) = -A(0,2)*A(1,1) + A(0,1)*A(1,2);
    B(1,0) =  A(1,2)*A(2,0) - A(1,0)*A(2,2); B(1,1) = -A(0,2)*A(2,0) + A(0,0)*A(2,2); B(1,2) =  A(0,2)*A(1,0) - A(0,0)*A(1,2);
    B(2,0) = -A(1,1)*A(2,0) + A(1,0)*A(2,1); B(2,1) =  A(0,1)*A(2,0) - A(0,0)*A(2,1); B(2,2) = -A(0,1)*A(1,0) + A(0,0)*A(1,1);

    B /= det();

    return B;
  }